

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O3

void __thiscall HighsSimplexAnalysis::summaryReport(HighsSimplexAnalysis *this)

{
  HighsLogOptions *log_options;
  uint uVar1;
  uint uVar2;
  int iVar3;
  EdgeWeightMode EVar4;
  bool bVar5;
  bool bVar6;
  AnIterOpRec *pAVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  HighsInt *pHVar11;
  uint uVar12;
  int iVar13;
  HighsSimplexAnalysis *this_00;
  long lVar14;
  uint uVar15;
  uint uVar16;
  HighsValueDistribution *value_distribution;
  double dVar17;
  double dVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double local_70;
  string str_edge_weight_mode;
  
  iVar13 = this->AnIterIt0;
  uVar12 = this->simplex_iteration_count - iVar13;
  if (uVar12 == 0 || this->simplex_iteration_count < iVar13) {
    return;
  }
  printf("\nAnalysis of %d iterations (%d to %d)\n",(ulong)uVar12,(ulong)(iVar13 + 1));
  uVar16 = this->AnIterNumEdWtIt[2];
  if (0 < (int)uVar16) {
    printf("DSE for %12d (%3d%%) iterations\n",(ulong)uVar16,(ulong)(uVar16 * 100) / (ulong)uVar12);
  }
  uVar16 = this->AnIterNumEdWtIt[1];
  if (0 < (int)uVar16) {
    printf("Dvx for %12d (%3d%%) iterations\n",(ulong)uVar16,(ulong)(uVar16 * 100) / (ulong)uVar12);
  }
  uVar16 = this->AnIterNumEdWtIt[0];
  if (0 < (int)uVar16) {
    printf("Dan for %12d (%3d%%) iterations\n",(ulong)uVar16,(ulong)(uVar16 * 100) / (ulong)uVar12);
  }
  log_options = &this->log_options;
  pAVar7 = this->AnIterOp;
  lVar14 = 10;
  do {
    value_distribution = &pAVar7->AnIterOp_density;
    uVar16 = *(uint *)((long)(value_distribution + -1) + 0x5c);
    printf("\n%-10s performed %d times\n",*(undefined8 *)((long)(value_distribution + -1) + 0x78),
           (ulong)uVar16);
    if (0 < (int)uVar16) {
      uVar15 = *(uint *)((long)(value_distribution + -1) + 0x60);
      uVar1 = *(uint *)((long)(value_distribution + -1) + 100);
      dVar17 = pow(10.0,*(double *)((long)(value_distribution + -1) + 0x68) / (double)(int)uVar16);
      uVar2 = *(uint *)((long)(value_distribution + -1) + 0x58);
      printf("%12d hyper-sparse operations (%3d%%)\n",(ulong)uVar15,
             (ulong)(uint)((int)(uVar15 * 100) / (int)uVar16));
      printf("%12d hyper-sparse results    (%3d%%)\n",(ulong)uVar1,(int)(uVar1 * 100) / (int)uVar16)
      ;
      printf("%12g density of result (%d / %d nonzeros)\n",dVar17,
             (ulong)(uint)(int)((double)(int)uVar2 * dVar17),(ulong)uVar2);
      logValueDistribution
                (log_options,value_distribution,
                 *(HighsInt *)((long)(value_distribution + -1) + 0x58));
    }
    pAVar7 = (AnIterOpRec *)(value_distribution + 1);
    lVar14 = lVar14 + -1;
  } while (lVar14 != 0);
  lVar14 = 0;
  uVar16 = 0;
  do {
    uVar16 = uVar16 + this->AnIterNumInvert[lVar14 + 1];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0xb);
  if (0 < (int)uVar16) {
    printf("\nInvert    performed %d times: average frequency = %d\n",(ulong)uVar16,
           (ulong)uVar12 / (ulong)uVar16);
    uVar15 = this->AnIterNumInvert[1];
    if (0 < (int)uVar15) {
      printf("%12d (%3d%%) Invert operations due to update limit reached\n",(ulong)uVar15,
             (ulong)(uVar15 * 100) / (ulong)uVar16);
    }
    uVar15 = this->AnIterNumInvert[2];
    if (0 < (int)uVar15) {
      printf("%12d (%3d%%) Invert operations due to pseudo-clock\n",(ulong)uVar15,
             (ulong)(uVar15 * 100) / (ulong)uVar16);
    }
    uVar15 = this->AnIterNumInvert[3];
    if (0 < (int)uVar15) {
      printf("%12d (%3d%%) Invert operations due to possibly optimal\n",(ulong)uVar15,
             (ulong)(uVar15 * 100) / (ulong)uVar16);
    }
    uVar15 = this->AnIterNumInvert[5];
    if (0 < (int)uVar15) {
      printf("%12d (%3d%%) Invert operations due to possibly primal unbounded\n",(ulong)uVar15,
             (ulong)(uVar15 * 100) / (ulong)uVar16);
    }
    uVar15 = this->AnIterNumInvert[6];
    if (0 < (int)uVar15) {
      printf("%12d (%3d%%) Invert operations due to possibly dual unbounded\n",(ulong)uVar15,
             (ulong)(uVar15 * 100) / (ulong)uVar16);
    }
    uVar15 = this->AnIterNumInvert[7];
    if (0 < (int)uVar15) {
      printf("%12d (%3d%%) Invert operations due to possibly singular basis\n",(ulong)uVar15,
             (ulong)(uVar15 * 100) / (ulong)uVar16);
    }
    uVar15 = this->AnIterNumInvert[8];
    if (0 < (int)uVar15) {
      printf("%12d (%3d%%) Invert operations due to primal infeasible in primal simplex\n",
             (ulong)uVar15,(ulong)(uVar15 * 100) / (ulong)uVar16);
    }
  }
  iVar13 = this->num_row_price + this->num_col_price;
  uVar16 = iVar13 + this->num_row_price_with_switch;
  if (uVar16 != 0 && SCARRY4(iVar13,this->num_row_price_with_switch) == (int)uVar16 < 0) {
    printf("\n%12d Price operations:\n",(ulong)uVar16);
    printf("%12d Col Price      (%3d%%)\n",(ulong)(uint)this->num_col_price,
           (long)(this->num_col_price * 100) / (long)(int)uVar16 & 0xffffffff);
    printf("%12d Row Price      (%3d%%)\n",(ulong)(uint)this->num_row_price,
           (long)(this->num_row_price * 100) / (long)(int)uVar16 & 0xffffffff);
    printf("%12d Row PriceWSw   (%3d%%)\n",(ulong)(uint)this->num_row_price_with_switch,
           (long)(this->num_row_price_with_switch * 100) / (long)(int)uVar16 & 0xffffffff);
  }
  printf("\n%12d (%3d%%) costly DSE        iterations\n",(ulong)(uint)this->num_costly_DSE_iteration
         ,(long)(this->num_costly_DSE_iteration * 100) / (long)(int)uVar12 & 0xffffffff);
  if (this->num_devex_framework != 0) {
    puts("\nDevex summary");
    printf("%12d Devex frameworks\n",(ulong)(uint)this->num_devex_framework);
    printf("%12d average number of iterations\n",
           (long)this->AnIterNumEdWtIt[1] / (long)this->num_devex_framework & 0xffffffff,
           (long)this->AnIterNumEdWtIt[1] % (long)this->num_devex_framework & 0xffffffff);
  }
  if (this->num_dual_cycling_detections + this->num_primal_cycling_detections == 0)
  goto LAB_003600ec;
  printf("\nCycling detected %d times:");
  if (this->num_primal_cycling_detections == 0) {
LAB_003600c8:
    if (this->num_dual_cycling_detections != 0) {
      printf("%d in dual simplex");
    }
  }
  else {
    printf("%d in primal simplex");
    if (this->num_dual_cycling_detections != 0) {
      printf("; ");
      goto LAB_003600c8;
    }
  }
  putchar(10);
LAB_003600ec:
  iVar13 = this->num_quad_chuzc;
  uVar12 = this->num_heap_chuzc;
  uVar9 = (ulong)uVar12;
  uVar16 = (uint)(this->sum_quad_chuzc_size / (double)iVar13);
  if (iVar13 == 0) {
    uVar16 = 0;
  }
  uVar15 = (uint)(this->sum_heap_chuzc_size / (double)(int)uVar12);
  if (uVar12 == 0) {
    uVar15 = 0;
  }
  if (iVar13 + uVar12 != 0) {
    puts("\nQuad/heap CHUZC summary");
    if (this->num_quad_chuzc != 0) {
      printf("%12d quad CHUZC: average / max = %d / %d\n",(ulong)(uint)this->num_quad_chuzc,
             (ulong)uVar16,(ulong)(uint)this->max_quad_chuzc_size);
    }
    if (this->num_heap_chuzc == 0) {
      uVar9 = 0;
    }
    else {
      printf("%12d heap CHUZC: average / max = %d / %d\n",(ulong)(uint)this->num_heap_chuzc,
             (ulong)uVar15,(ulong)(uint)this->max_heap_chuzc_size);
      uVar9 = (ulong)(uint)this->num_heap_chuzc;
    }
  }
  printf("\ngrepQuadHeapChuzc,%s,%s, %d, ,%d,%d, %d, ,%d,%d\n",(this->model_name_)._M_dataplus._M_p,
         (this->lp_name_)._M_dataplus._M_p,(ulong)(uint)this->num_quad_chuzc,(ulong)uVar16,
         (ulong)(uint)this->max_quad_chuzc_size,uVar9,(ulong)uVar15,
         (ulong)(uint)this->max_heap_chuzc_size);
  if (-1 < this->num_improve_choose_column_row_call) {
    printf("\nDual_CHUZC: Number of improve CHUZC row calls =  %d\n");
    printf("Dual_CHUZC: Number of pivots removed from pack = %d\n",
           (ulong)(uint)this->num_remove_pivot_from_pack);
  }
  uVar9 = (ulong)(uint)this->num_single_cost_shift;
  if (this->num_correct_dual_cost_shift + this->num_correct_dual_primal_flip +
      this->num_single_cost_shift != 0) {
    puts("\nFlip/shift summary");
    if (this->num_correct_dual_primal_flip != 0) {
      printf("%12d   correct dual primal flips (max = %g) for min dual infeasibility = %g\n",
             this->max_correct_dual_primal_flip,
             SUB84(this->min_correct_dual_primal_flip_dual_infeasibility,0));
    }
    if (this->num_correct_dual_cost_shift != 0) {
      printf("%12d   correct dual  cost shifts (max = %g) for max dual infeasibility = %g\n",
             this->max_correct_dual_cost_shift,
             SUB84(this->max_correct_dual_cost_shift_dual_infeasibility,0));
    }
    if (this->num_single_cost_shift == 0) {
      uVar9 = 0;
    }
    else {
      printf("%12d   single        cost shifts (sum / max = %g / %g)\n",this->sum_single_cost_shift,
             SUB84(this->max_single_cost_shift,0));
      uVar9 = (ulong)(uint)this->num_single_cost_shift;
    }
  }
  printf("\ngrepFlipShift,%s,%s,%d,%g,%g,%d,%g,%g,%d,%g,%g\n",this->max_correct_dual_primal_flip,
         SUB84(this->min_correct_dual_primal_flip_dual_infeasibility,0),
         this->max_correct_dual_cost_shift,this->max_correct_dual_cost_shift_dual_infeasibility,
         this->sum_single_cost_shift,this->max_single_cost_shift,
         (this->model_name_)._M_dataplus._M_p,(this->lp_name_)._M_dataplus._M_p,
         (ulong)(uint)this->num_correct_dual_primal_flip,
         (ulong)(uint)this->num_correct_dual_cost_shift,uVar9);
  iVar13 = this->sum_multi_chosen;
  if (0 < iVar13) {
    iVar8 = this->sum_multi_finished;
    printf("\nPAMI summary: for average of %0.1g threads \n",this->average_concurrency);
    printf("%12d Major iterations\n",(ulong)(uint)this->multi_iteration_count);
    printf("%12d Minor iterations\n",(ulong)(uint)this->sum_multi_finished);
    printf("%12d Total rows chosen: performed %3d%% of possible minor iterations\n\n",
           (ulong)(uint)this->sum_multi_chosen,(long)(iVar8 * 100) / (long)iVar13 & 0xffffffff);
  }
  highsLogDev(log_options,kInfo,"\nCost perturbation summary\n");
  logValueDistribution(log_options,&this->cost_perturbation1_distribution,0);
  logValueDistribution(log_options,&this->cost_perturbation2_distribution,0);
  logValueDistribution(log_options,&this->before_ftran_upper_sparse_density,this->numRow);
  logValueDistribution(log_options,&this->ftran_upper_sparse_density,this->numRow);
  logValueDistribution(log_options,&this->before_ftran_upper_hyper_density,this->numRow);
  logValueDistribution(log_options,&this->ftran_upper_hyper_density,this->numRow);
  logValueDistribution(log_options,&this->primal_step_distribution,0);
  logValueDistribution(log_options,&this->dual_step_distribution,0);
  logValueDistribution(log_options,&this->simplex_pivot_distribution,0);
  logValueDistribution(log_options,&this->factor_pivot_threshold_distribution,0);
  logValueDistribution(log_options,&this->numerical_trouble_distribution,0);
  logValueDistribution(log_options,&this->edge_weight_error_distribution,0);
  logValueDistribution(log_options,&this->cleanup_dual_change_distribution,0);
  logValueDistribution(log_options,&this->cleanup_primal_step_distribution,0);
  logValueDistribution(log_options,&this->cleanup_dual_step_distribution,0);
  logValueDistribution(log_options,&this->cleanup_primal_change_distribution,0);
  if (99 < this->AnIterTraceIterDl) {
    iVar13 = this->simplex_iteration_count;
    iVar8 = this->AnIterTraceNumRec;
    iVar3 = this->AnIterTrace[iVar8].AnIterTraceIter;
    if (iVar3 < iVar13) {
      this->AnIterTraceNumRec = iVar8 + 1;
      this->AnIterTrace[(long)iVar8 + 1].AnIterTraceIter = iVar13;
      lVar14 = std::chrono::_V2::system_clock::now();
      this->AnIterTrace[(long)iVar8 + 1].AnIterTraceTime = (double)lVar14 / 1000000000.0;
      dVar17 = this->average_fraction_of_possible_minor_iterations_performed;
      uVar19 = SUB84(dVar17,0);
      uVar20 = (undefined4)((ulong)dVar17 >> 0x20);
      dVar18 = 0.0;
      if (dVar17 <= 0.0) {
        uVar19 = 0;
        uVar20 = 0;
      }
      this->AnIterTrace[(long)iVar8 + 1].AnIterTraceMulti = (double)CONCAT44(uVar20,uVar19);
      this->AnIterTrace[(long)iVar8 + 1].AnIterTraceDensity[6] = this->col_aq_density;
      this->AnIterTrace[(long)iVar8 + 1].AnIterTraceDensity[4] = this->row_ep_density;
      this->AnIterTrace[(long)iVar8 + 1].AnIterTraceDensity[5] = this->row_ap_density;
      this->AnIterTrace[(long)iVar8 + 1].AnIterTraceDensity[7] = this->col_aq_density;
      EVar4 = this->edge_weight_mode;
      if (EVar4 == kSteepestEdge) {
        this->AnIterTrace[(long)iVar8 + 1].AnIterTraceDensity[8] = this->row_DSE_density;
        this->AnIterTrace[(long)iVar8 + 1].AnIterTraceDensity[9] = this->col_steepest_edge_density;
        dVar18 = this->costly_DSE_measure;
      }
      else {
        this->AnIterTrace[(long)iVar8 + 1].AnIterTraceDensity[8] = 0.0;
      }
      this->AnIterTrace[(long)iVar8 + 1].AnIterTraceCostlyDse = dVar18;
      this->AnIterTrace[(long)iVar8 + 1].AnIterTrace_simplex_strategy = this->simplex_strategy;
      this->AnIterTrace[(long)iVar8 + 1].AnIterTrace_edge_weight_mode = EVar4;
      iVar8 = this->AnIterTraceNumRec;
    }
    if (iVar8 < 1) {
      bVar5 = false;
      bVar6 = false;
    }
    else {
      dVar18 = 0.0;
      dVar17 = 0.0;
      lVar14 = 0;
      do {
        dVar17 = dVar17 + ABS(*(double *)
                               ((long)this->AnIterTrace[1].AnIterTraceDensity + lVar14 + -8));
        dVar18 = dVar18 + ABS(*(double *)
                               ((long)this->AnIterTrace[1].AnIterTraceDensity + lVar14 + 0x40));
        lVar14 = lVar14 + 0x78;
      } while ((ulong)(iVar8 + 1) * 0x78 + -0x78 != lVar14);
      bVar6 = 0.0 < dVar17;
      bVar5 = 0.0 < dVar18;
    }
    puts("\n Iteration speed analysis");
    uVar12 = this->AnIterTrace[0].AnIterTraceIter;
    local_70 = this->AnIterTrace[0].AnIterTraceTime;
    printf("        Iter (      FmIter:      ToIter)      Time      Iter/sec ");
    if (bVar6) {
      printf("| PAMI ");
    }
    printf("| C_Aq R_Ep R_Ap ");
    if (bVar5) {
      printf(" DSE ");
      printf(" PSE ");
    }
    printf("| EdWt ");
    if (bVar5) {
      puts("| CostlyDse");
    }
    else {
      putchar(10);
    }
    uVar9 = (ulong)(uint)this->AnIterTraceNumRec;
    if (0 < this->AnIterTraceNumRec) {
      pHVar11 = &this->AnIterTrace[1].AnIterTrace_edge_weight_mode;
      lVar14 = 0;
      do {
        lVar14 = lVar14 + 1;
        uVar16 = pHVar11[-2];
        dVar17 = ((AnIterTraceRec *)(pHVar11 + -0x1c))->AnIterTraceTime;
        uVar15 = uVar16 - uVar12;
        if ((lVar14 < (int)uVar9) && (uVar15 != this->AnIterTraceIterDl)) {
          printf("STRANGE: %d = dlIter != AnIterTraceIterDl = %d\n");
        }
        iVar8 = *pHVar11;
        str_edge_weight_mode._M_dataplus._M_p = (pointer)&str_edge_weight_mode.field_2;
        str_edge_weight_mode._M_string_length = 0;
        str_edge_weight_mode.field_2._M_local_buf[0] = '\0';
        pcVar10 = "Dan";
        if (iVar8 != 0) {
          pcVar10 = "XXX";
        }
        if (iVar8 == 1) {
          pcVar10 = "Dvx";
        }
        if (iVar8 == 2) {
          pcVar10 = "DSE";
        }
        std::__cxx11::string::_M_replace((ulong)&str_edge_weight_mode,0,(char *)0x0,(ulong)pcVar10);
        local_70 = dVar17 - local_70;
        uVar1 = (int)((double)(int)uVar15 / local_70);
        if (local_70 <= 0.0) {
          uVar1 = 0;
        }
        printf("%12d (%12d:%12d) %9.4f  %12d ",(ulong)uVar15,(ulong)uVar12,(ulong)uVar16,
               (ulong)uVar1);
        if (bVar6) {
          printf("|  %3d ",(ulong)(uint)(int)(*(double *)(pHVar11 + -0x1a) * 100.0));
        }
        this_00 = (HighsSimplexAnalysis *)0x7c;
        putchar(0x7c);
        printOneDensity(this_00,*(double *)(pHVar11 + -0xc));
        printOneDensity(this_00,*(double *)(pHVar11 + -0x10));
        printOneDensity(this_00,*(double *)(pHVar11 + -0xe));
        if (bVar5) {
          if (iVar8 == 2) {
            printOneDensity(this_00,*(double *)(pHVar11 + -8));
            printf(" |  %3s ");
            pcVar10 = "|     ";
            printf("|     ");
            dVar18 = *(double *)(pHVar11 + -4);
          }
          else {
            printOneDensity(this_00,0.0);
            printf(" |  %3s ");
            pcVar10 = "|     ";
            printf("|     ");
            dVar18 = 0.0;
          }
          printOneDensity((HighsSimplexAnalysis *)pcVar10,dVar18);
        }
        else {
          printf(" |  %3s ");
        }
        putchar(10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str_edge_weight_mode._M_dataplus._M_p != &str_edge_weight_mode.field_2) {
          operator_delete(str_edge_weight_mode._M_dataplus._M_p);
        }
        uVar9 = (ulong)this->AnIterTraceNumRec;
        pHVar11 = pHVar11 + 0x1e;
        uVar12 = uVar16;
        local_70 = dVar17;
      } while (lVar14 < (long)uVar9);
    }
    putchar(10);
    if (iVar3 < iVar13) {
      this->AnIterTraceNumRec = this->AnIterTraceNumRec + -1;
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::summaryReport() {
  assert(analyse_simplex_summary_data);
  HighsInt AnIterNumIter = simplex_iteration_count - AnIterIt0;
  if (AnIterNumIter <= 0) return;
  printf("\nAnalysis of %" HIGHSINT_FORMAT " iterations (%" HIGHSINT_FORMAT
         " to %" HIGHSINT_FORMAT ")\n",
         AnIterNumIter, AnIterIt0 + 1, simplex_iteration_count);
  if (AnIterNumIter <= 0) return;
  HighsInt lc_EdWtNumIter;
  lc_EdWtNumIter = AnIterNumEdWtIt[(HighsInt)EdgeWeightMode::kSteepestEdge];
  if (lc_EdWtNumIter > 0)
    printf("DSE for %12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
           "%%) iterations\n",
           lc_EdWtNumIter, (100 * lc_EdWtNumIter) / AnIterNumIter);
  lc_EdWtNumIter = AnIterNumEdWtIt[(HighsInt)EdgeWeightMode::kDevex];
  if (lc_EdWtNumIter > 0)
    printf("Dvx for %12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
           "%%) iterations\n",
           lc_EdWtNumIter, (100 * lc_EdWtNumIter) / AnIterNumIter);
  lc_EdWtNumIter = AnIterNumEdWtIt[(HighsInt)EdgeWeightMode::kDantzig];
  if (lc_EdWtNumIter > 0)
    printf("Dan for %12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
           "%%) iterations\n",
           lc_EdWtNumIter, (100 * lc_EdWtNumIter) / AnIterNumIter);
  for (HighsInt k = 0; k < kNumSimplexNlaOperation; k++) {
    AnIterOpRec& AnIter = AnIterOp[k];
    HighsInt lcNumCa = AnIter.AnIterOpNumCa;
    printf("\n%-10s performed %" HIGHSINT_FORMAT " times\n",
           AnIter.AnIterOpName.c_str(), AnIter.AnIterOpNumCa);
    if (lcNumCa > 0) {
      HighsInt lcHyperOp = AnIter.AnIterOpNumHyperOp;
      HighsInt lcHyperRs = AnIter.AnIterOpNumHyperRs;
      HighsInt pctHyperOp = (100 * lcHyperOp) / lcNumCa;
      HighsInt pctHyperRs = (100 * lcHyperRs) / lcNumCa;
      double lcRsDensity =
          pow(10.0, AnIter.AnIterOpSumLog10RsDensity / lcNumCa);
      HighsInt lcAnIterOpRsDim = AnIter.AnIterOpRsDim;
      HighsInt lcNumNNz = lcRsDensity * lcAnIterOpRsDim;
      printf("%12" HIGHSINT_FORMAT
             " hyper-sparse operations (%3" HIGHSINT_FORMAT "%%)\n",
             lcHyperOp, pctHyperOp);
      printf("%12" HIGHSINT_FORMAT
             " hyper-sparse results    (%3" HIGHSINT_FORMAT "%%)\n",
             lcHyperRs, pctHyperRs);
      printf("%12g density of result (%" HIGHSINT_FORMAT " / %" HIGHSINT_FORMAT
             " nonzeros)\n",
             lcRsDensity, lcNumNNz, lcAnIterOpRsDim);
      logValueDistribution(log_options, AnIter.AnIterOp_density,
                           AnIter.AnIterOpRsDim);
    }
  }
  HighsInt NumInvert = 0;

  HighsInt last_rebuild_reason = kRebuildReasonCount - 1;
  for (HighsInt k = 1; k <= last_rebuild_reason; k++)
    NumInvert += AnIterNumInvert[k];
  if (NumInvert > 0) {
    HighsInt lcNumInvert = 0;
    printf("\nInvert    performed %" HIGHSINT_FORMAT
           " times: average frequency = %" HIGHSINT_FORMAT "\n",
           NumInvert, AnIterNumIter / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonUpdateLimitReached];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to update limit reached\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonSyntheticClockSaysInvert];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to pseudo-clock\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonPossiblyOptimal];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to possibly optimal\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonPossiblyPrimalUnbounded];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to possibly primal unbounded\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonPossiblyDualUnbounded];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to possibly dual unbounded\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonPossiblySingularBasis];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to possibly singular basis\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert =
        AnIterNumInvert[kRebuildReasonPrimalInfeasibleInPrimalSimplex];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to primal infeasible in primal "
             "simplex\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
  }
  HighsInt suPrice = num_col_price + num_row_price + num_row_price_with_switch;
  if (suPrice > 0) {
    printf("\n%12" HIGHSINT_FORMAT " Price operations:\n", suPrice);
    printf("%12" HIGHSINT_FORMAT " Col Price      (%3" HIGHSINT_FORMAT "%%)\n",
           num_col_price, (100 * num_col_price) / suPrice);
    printf("%12" HIGHSINT_FORMAT " Row Price      (%3" HIGHSINT_FORMAT "%%)\n",
           num_row_price, (100 * num_row_price) / suPrice);
    printf("%12" HIGHSINT_FORMAT " Row PriceWSw   (%3" HIGHSINT_FORMAT "%%)\n",
           num_row_price_with_switch,
           (100 * num_row_price_with_switch / suPrice));
  }
  printf("\n%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
         "%%) costly DSE        iterations\n",
         num_costly_DSE_iteration,
         (100 * num_costly_DSE_iteration) / AnIterNumIter);

  // Look for any Devex data to summarise
  if (num_devex_framework) {
    printf("\nDevex summary\n");
    printf("%12" HIGHSINT_FORMAT " Devex frameworks\n", num_devex_framework);
    printf("%12" HIGHSINT_FORMAT " average number of iterations\n",
           AnIterNumEdWtIt[(HighsInt)EdgeWeightMode::kDevex] /
               num_devex_framework);
  }

  if (num_primal_cycling_detections + num_dual_cycling_detections) {
    printf("\nCycling detected %" HIGHSINT_FORMAT " times:",
           num_primal_cycling_detections + num_dual_cycling_detections);
    if (num_primal_cycling_detections) {
      printf("%" HIGHSINT_FORMAT " in primal simplex",
             num_primal_cycling_detections);
      if (num_dual_cycling_detections) printf("; ");
    }
    if (num_dual_cycling_detections)
      printf("%" HIGHSINT_FORMAT " in dual simplex",
             num_dual_cycling_detections);
    printf("\n");
  }

  const double average_quad_chuzc_size =
      num_quad_chuzc ? sum_quad_chuzc_size / num_quad_chuzc : 0;
  const double average_heap_chuzc_size =
      num_heap_chuzc ? sum_heap_chuzc_size / num_heap_chuzc : 0;
  if (num_quad_chuzc + num_heap_chuzc) {
    printf("\nQuad/heap CHUZC summary\n");
    if (num_quad_chuzc)
      printf("%12" HIGHSINT_FORMAT
             " quad CHUZC: average / max = %d / %" HIGHSINT_FORMAT "\n",
             num_quad_chuzc, (int)average_quad_chuzc_size, max_quad_chuzc_size);
    if (num_heap_chuzc)
      printf("%12" HIGHSINT_FORMAT
             " heap CHUZC: average / max = %d / %" HIGHSINT_FORMAT "\n",
             num_heap_chuzc, (int)average_heap_chuzc_size, max_heap_chuzc_size);
  }
  printf("\ngrepQuadHeapChuzc,%s,%s, %" HIGHSINT_FORMAT
         ", ,%d,%" HIGHSINT_FORMAT ", %" HIGHSINT_FORMAT
         ", ,%d,%" HIGHSINT_FORMAT "\n",
         model_name_.c_str(), lp_name_.c_str(), num_quad_chuzc,
         (int)average_quad_chuzc_size, max_quad_chuzc_size, num_heap_chuzc,
         (int)average_heap_chuzc_size, max_heap_chuzc_size);

  if (num_improve_choose_column_row_call >= 0) {
    printf("\nDual_CHUZC: Number of improve CHUZC row calls =  %d\n",
           (int)num_improve_choose_column_row_call);
    printf("Dual_CHUZC: Number of pivots removed from pack = %d\n",
           (int)num_remove_pivot_from_pack);
  } else {
    assert(num_remove_pivot_from_pack == 0);
  }

  if (num_correct_dual_primal_flip + num_correct_dual_cost_shift +
      num_single_cost_shift) {
    printf("\nFlip/shift summary\n");
    if (num_correct_dual_primal_flip) {
      printf(
          "%12" HIGHSINT_FORMAT
          "   correct dual primal flips (max = %g) for min dual infeasibility "
          "= %g\n",
          num_correct_dual_primal_flip, max_correct_dual_primal_flip,
          min_correct_dual_primal_flip_dual_infeasibility);
    }
    if (num_correct_dual_cost_shift) {
      printf(
          "%12" HIGHSINT_FORMAT
          "   correct dual  cost shifts (max = %g) for max dual infeasibility "
          "= %g\n",
          num_correct_dual_cost_shift, max_correct_dual_cost_shift,
          max_correct_dual_cost_shift_dual_infeasibility);
    }
    if (num_single_cost_shift) {
      printf("%12" HIGHSINT_FORMAT
             "   single        cost shifts (sum / max = %g / %g)\n",
             num_single_cost_shift, sum_single_cost_shift,
             max_single_cost_shift);
    }
  }
  printf("\ngrepFlipShift,%s,%s,%" HIGHSINT_FORMAT ",%g,%g,%" HIGHSINT_FORMAT
         ",%g,%g,%" HIGHSINT_FORMAT ",%g,%g\n",
         model_name_.c_str(), lp_name_.c_str(), num_correct_dual_primal_flip,
         max_correct_dual_primal_flip,
         min_correct_dual_primal_flip_dual_infeasibility,
         num_correct_dual_cost_shift, max_correct_dual_cost_shift,
         max_correct_dual_cost_shift_dual_infeasibility, num_single_cost_shift,
         sum_single_cost_shift, max_single_cost_shift);

  // Look for any PAMI data to summarise
  if (sum_multi_chosen > 0) {
    const HighsInt pct_minor_iterations_performed =
        (100 * sum_multi_finished) / sum_multi_chosen;
    printf("\nPAMI summary: for average of %0.1g threads \n",
           average_concurrency);
    printf("%12" HIGHSINT_FORMAT " Major iterations\n", multi_iteration_count);
    printf("%12" HIGHSINT_FORMAT " Minor iterations\n", sum_multi_finished);
    printf("%12" HIGHSINT_FORMAT
           " Total rows chosen: performed %3" HIGHSINT_FORMAT
           "%% of possible minor "
           "iterations\n\n",
           sum_multi_chosen, pct_minor_iterations_performed);
  }

  highsLogDev(log_options, HighsLogType::kInfo,
              "\nCost perturbation summary\n");
  logValueDistribution(log_options, cost_perturbation1_distribution);
  logValueDistribution(log_options, cost_perturbation2_distribution);

  logValueDistribution(log_options, before_ftran_upper_sparse_density, numRow);
  logValueDistribution(log_options, ftran_upper_sparse_density, numRow);
  logValueDistribution(log_options, before_ftran_upper_hyper_density, numRow);
  logValueDistribution(log_options, ftran_upper_hyper_density, numRow);
  logValueDistribution(log_options, primal_step_distribution);
  logValueDistribution(log_options, dual_step_distribution);
  logValueDistribution(log_options, simplex_pivot_distribution);
  logValueDistribution(log_options, factor_pivot_threshold_distribution);
  logValueDistribution(log_options, numerical_trouble_distribution);
  logValueDistribution(log_options, edge_weight_error_distribution);
  logValueDistribution(log_options, cleanup_dual_change_distribution);
  logValueDistribution(log_options, cleanup_primal_step_distribution);
  logValueDistribution(log_options, cleanup_dual_step_distribution);
  logValueDistribution(log_options, cleanup_primal_change_distribution);

  if (AnIterTraceIterDl >= 100) {
    // Possibly (usually) add a temporary record for the final
    // iterations: may end up with one more than
    // kAnIterTraceMaxNumRec records, so ensure that there is
    // enough space in the arrays
    //
    const bool add_extra_record =
        simplex_iteration_count >
        AnIterTrace[AnIterTraceNumRec].AnIterTraceIter;
    if (add_extra_record) {
      AnIterTraceNumRec++;
      AnIterTraceRec& lcAnIter = AnIterTrace[AnIterTraceNumRec];
      lcAnIter.AnIterTraceIter = simplex_iteration_count;
      lcAnIter.AnIterTraceTime = timer_->getWallTime();
      if (average_fraction_of_possible_minor_iterations_performed > 0) {
        lcAnIter.AnIterTraceMulti =
            average_fraction_of_possible_minor_iterations_performed;
      } else {
        lcAnIter.AnIterTraceMulti = 0;
      }
      lcAnIter.AnIterTraceDensity[kSimplexNlaFtran] = col_aq_density;
      lcAnIter.AnIterTraceDensity[kSimplexNlaBtranEp] = row_ep_density;
      lcAnIter.AnIterTraceDensity[kSimplexNlaPriceAp] = row_ap_density;
      lcAnIter.AnIterTraceDensity[kSimplexNlaFtranBfrt] = col_aq_density;
      if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
        lcAnIter.AnIterTraceDensity[kSimplexNlaFtranDse] = row_DSE_density;
        lcAnIter.AnIterTraceDensity[kSimplexNlaBtranPse] =
            col_steepest_edge_density;
        lcAnIter.AnIterTraceCostlyDse = costly_DSE_measure;
      } else {
        lcAnIter.AnIterTraceDensity[kSimplexNlaFtranDse] = 0;
        lcAnIter.AnIterTraceCostlyDse = 0;
      }
      lcAnIter.AnIterTrace_simplex_strategy = (HighsInt)simplex_strategy;
      lcAnIter.AnIterTrace_edge_weight_mode = (HighsInt)edge_weight_mode;
    }
    // Determine whether the Multi and steepest edge columns should be reported
    double su_multi_values = 0;
    double su_dse_values = 0;
    double su_pse_values = 0;
    for (HighsInt rec = 1; rec <= AnIterTraceNumRec; rec++) {
      AnIterTraceRec& lcAnIter = AnIterTrace[rec];
      su_multi_values += fabs(lcAnIter.AnIterTraceMulti);
      su_dse_values += fabs(lcAnIter.AnIterTraceDensity[kSimplexNlaFtranDse]);
      su_pse_values += fabs(lcAnIter.AnIterTraceDensity[kSimplexNlaBtranPse]);
    }
    const bool report_multi = su_multi_values > 0;
    const bool rp_dual_steepest_edge = su_dse_values > 0;
    const bool rp_primal_steepest_edge = su_pse_values > 0;
    printf("\n Iteration speed analysis\n");
    AnIterTraceRec& lcAnIter = AnIterTrace[0];
    HighsInt fmIter = lcAnIter.AnIterTraceIter;
    double fmTime = lcAnIter.AnIterTraceTime;
    printf("        Iter (      FmIter:      ToIter)      Time      Iter/sec ");
    if (report_multi) printf("| PAMI ");
    printf("| C_Aq R_Ep R_Ap ");
    if (rp_dual_steepest_edge) printf(" DSE ");
    if (rp_primal_steepest_edge) printf(" PSE ");
    printf("| EdWt ");
    if (rp_dual_steepest_edge) {
      printf("| CostlyDse\n");
    } else {
      printf("\n");
    }

    for (HighsInt rec = 1; rec <= AnIterTraceNumRec; rec++) {
      AnIterTraceRec& lcAnIter = AnIterTrace[rec];
      HighsInt toIter = lcAnIter.AnIterTraceIter;
      double toTime = lcAnIter.AnIterTraceTime;
      HighsInt dlIter = toIter - fmIter;
      if (rec < AnIterTraceNumRec && dlIter != AnIterTraceIterDl)
        printf("STRANGE: %" HIGHSINT_FORMAT
               " = dlIter != AnIterTraceIterDl = %" HIGHSINT_FORMAT "\n",
               dlIter, AnIterTraceIterDl);
      double dlTime = toTime - fmTime;
      HighsInt iterSpeed = 0;
      if (dlTime > 0) iterSpeed = dlIter / dlTime;
      HighsInt lc_edge_weight_mode = lcAnIter.AnIterTrace_edge_weight_mode;
      std::string str_edge_weight_mode;
      if (lc_edge_weight_mode == (HighsInt)EdgeWeightMode::kSteepestEdge)
        str_edge_weight_mode = "DSE";
      else if (lc_edge_weight_mode == (HighsInt)EdgeWeightMode::kDevex)
        str_edge_weight_mode = "Dvx";
      else if (lc_edge_weight_mode == (HighsInt)EdgeWeightMode::kDantzig)
        str_edge_weight_mode = "Dan";
      else
        str_edge_weight_mode = "XXX";
      printf("%12" HIGHSINT_FORMAT " (%12" HIGHSINT_FORMAT
             ":%12" HIGHSINT_FORMAT ") %9.4f  %12" HIGHSINT_FORMAT " ",
             dlIter, fmIter, toIter, dlTime, iterSpeed);
      if (report_multi) {
        const HighsInt pct = (100 * lcAnIter.AnIterTraceMulti);
        printf("|  %3" HIGHSINT_FORMAT " ", pct);
      }
      printf("|");
      printOneDensity(lcAnIter.AnIterTraceDensity[kSimplexNlaFtran]);
      printOneDensity(lcAnIter.AnIterTraceDensity[kSimplexNlaBtranEp]);
      printOneDensity(lcAnIter.AnIterTraceDensity[kSimplexNlaPriceAp]);
      if (rp_dual_steepest_edge) {
        double use_DSE_density;
        if (lc_edge_weight_mode == (HighsInt)EdgeWeightMode::kSteepestEdge) {
          use_DSE_density = lcAnIter.AnIterTraceDensity[kSimplexNlaFtranDse];
        } else {
          use_DSE_density = 0;
        }
        printOneDensity(use_DSE_density);
      }
      printf(" |  %3s ", str_edge_weight_mode.c_str());
      if (rp_dual_steepest_edge) {
        double use_costly_dse;
        printf("|     ");
        if (lc_edge_weight_mode == (HighsInt)EdgeWeightMode::kSteepestEdge) {
          use_costly_dse = lcAnIter.AnIterTraceCostlyDse;
        } else {
          use_costly_dse = 0;
        }
        printOneDensity(use_costly_dse);
      }
      printf("\n");
      fmIter = toIter;
      fmTime = toTime;
    }
    printf("\n");
    // Remove any temporary record added for the final iterations
    if (add_extra_record) AnIterTraceNumRec--;
  }
}